

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Queries::DefaultsTest::testQueryParameter
          (DefaultsTest *this,GLenum pname,GLuint expected_value,GLchar *target_name)

{
  ostringstream *this_00;
  GLuint GVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLuint value;
  GLuint local_1b4;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b4 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xa20))(this->m_query_dsa,pname,&local_1b4);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetQueryObjectuiv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x13f);
  GVar1 = local_1b4;
  if (local_1b4 != expected_value) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"glGetQueryObjectuiv of query object with target ");
    std::operator<<((ostream *)this_00,target_name);
    std::operator<<((ostream *)this_00," with parameter ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," has returned ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,", however ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return GVar1 == expected_value;
}

Assistant:

bool DefaultsTest::testQueryParameter(const glw::GLenum pname, const glw::GLuint expected_value,
									  const glw::GLchar* target_name)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLuint value = 0;

	gl.getQueryObjectuiv(m_query_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv have failed");

	if (expected_value != value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetQueryObjectuiv of query object with target " << target_name
			<< " with parameter " << pname << " has returned " << value << ", however " << expected_value
			<< " was expected." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}